

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTests(Config *config)

{
  pointer pTVar1;
  TestCaseFilters *pTVar2;
  bool bVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong uVar7;
  pointer pbVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  undefined4 uVar12;
  TestCaseFilters *this;
  char *pcVar13;
  pointer this_00;
  pointer pcVar14;
  ulong uVar15;
  ulong uVar16;
  TestCase *pTVar17;
  string nameCol;
  Text tagsWrapper;
  Text nameWrapper;
  TextAttributes local_138;
  char *local_118;
  long local_110;
  char local_108 [16];
  TestCase *local_f8;
  Config *local_f0;
  Text local_e8;
  ulong local_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_78 [8];
  char local_70 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar13 = "All available test cases:\n";
    lVar11 = 0x1a;
  }
  else {
    pcVar13 = "Matching test cases:\n";
    lVar11 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar11);
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar4));
  pTVar17 = (TestCase *)*plVar6;
  local_f8 = (TestCase *)plVar6[1];
  if (pTVar17 == local_f8) {
    uVar15 = 0;
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    uVar15 = 0;
    do {
      pTVar1 = (config->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (config->m_filterSets).
                     super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1;
          this_00 = this_00 + 1) {
        bVar3 = TestCaseFilters::shouldInclude(this_00,pTVar17);
        if (!bVar3) goto LAB_001363be;
      }
      uVar16 = (pTVar17->super_TestCaseInfo).name._M_string_length;
      uVar10 = (pTVar17->super_TestCaseInfo).tagsAsString._M_string_length;
      if (uVar7 < uVar10) {
        uVar7 = uVar10;
      }
      if (uVar15 < uVar16) {
        uVar15 = uVar16;
      }
LAB_001363be:
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != local_f8);
  }
  uVar16 = uVar7 + uVar15;
  local_90 = uVar7;
  while (0x4b < uVar16) {
    uVar15 = uVar15 - (local_90 < 0x1f);
    local_90 = (local_90 - 1) + (ulong)(local_90 < 0x1f);
    uVar16 = local_90 + uVar15;
  }
  pTVar17 = (TestCase *)*plVar6;
  pcVar14 = (pointer)0x0;
  local_f0 = config;
  if (pTVar17 != local_f8) {
    do {
      pTVar2 = (local_f0->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (this = (local_f0->m_filterSets).
                  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != pTVar2; this = this + 1) {
        bVar3 = TestCaseFilters::shouldInclude(this,pTVar17);
        if (!bVar3) goto LAB_00136791;
      }
      local_e8.str.field_2._M_local_buf[8] = '\t';
      local_e8.str._M_dataplus._M_p = (pointer)0x2;
      local_e8.str._M_string_length = 4;
      local_e8.str.field_2._M_allocated_capacity = uVar15;
      Text::Text((Text *)local_88,(string *)pTVar17,(TextAttributes *)&local_e8);
      local_138.tabChar = '\t';
      local_138.width = local_90;
      local_138.initialIndent = 0;
      local_138.indent = 2;
      Text::Text(&local_e8,&(pTVar17->super_TestCaseInfo).tagsAsString,&local_138);
      if (0x1f < (ulong)((long)local_e8.lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_e8.lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start |
                        (long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        uVar7 = (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar11 = 0;
        uVar16 = 0;
        do {
          local_138.initialIndent = (size_t)&local_138.width;
          local_138.indent = 0;
          local_138.width = local_138.width & 0xffffffffffffff00;
          if (uVar16 < uVar7) {
            uVar12 = 0;
            if ((pTVar17->super_TestCaseInfo).isHidden != false) {
              uVar12 = 0x17;
            }
            std::__cxx11::string::_M_assign((string *)&local_138);
          }
          else {
            uVar12 = 0x17;
            std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,0x143dc3);
          }
          (**(code **)(*Colour::impl + 0x10))(Colour::impl,uVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_138.initialIndent,local_138.indent);
          (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
          if ((uVar16 < (ulong)((long)local_e8.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_e8.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
             (*(long *)((long)&(local_e8.lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                       lVar11) != 0)) {
            if (uVar16 == 0) {
              (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
              local_118 = local_108;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_118,(char)uVar15 - (char)local_138.indent);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_118,local_110);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
              if (local_118 != local_108) {
                operator_delete(local_118);
              }
              (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
              pbVar8 = local_e8.lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              local_118 = local_108;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_118,(char)uVar15 - (char)local_138.indent);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_118,local_110);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    ",4);
              if (local_118 != local_108) {
                operator_delete(local_118);
              }
              pbVar8 = (pointer)((long)&((local_e8.lines.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          if ((size_t *)local_138.initialIndent != &local_138.width) {
            operator_delete((void *)local_138.initialIndent);
          }
          uVar16 = uVar16 + 1;
          uVar7 = (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar10 = (long)local_e8.lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e8.lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar10 < uVar7) {
            uVar10 = uVar7;
          }
          lVar11 = lVar11 + 0x20;
        } while (uVar16 < uVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
        operator_delete(local_e8.str._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_88 != (undefined1  [8])local_78) {
        operator_delete((void *)local_88);
      }
      pcVar14 = pcVar14 + 1;
LAB_00136791:
      pTVar17 = pTVar17 + 1;
    } while (pTVar17 != local_f8);
  }
  local_88 = (undefined1  [8])pcVar14;
  if ((local_f0->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (local_f0->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"test case","");
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e8.str._M_dataplus._M_p,
               local_e8.str._M_dataplus._M_p + local_e8.str._M_string_length);
    poVar9 = operator<<((ostream *)&std::cout,(pluralise *)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  else {
    local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"matching test case","");
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e8.str._M_dataplus._M_p,
               local_e8.str._M_dataplus._M_p + local_e8.str._M_string_length);
    poVar9 = operator<<((ostream *)&std::cout,(pluralise *)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
    operator_delete(local_e8.str._M_dataplus._M_p);
  }
  return (size_t)pcVar14;
}

Assistant:

inline std::size_t listTests( Config const& config ) {
        if( config.filters().empty() )
            std::cout << "All available test cases:\n";
        else
            std::cout << "Matching test cases:\n";
        std::vector<TestCase> const& allTests = getRegistryHub().getTestCaseRegistry().getAllTests();
        std::vector<TestCase>::const_iterator it = allTests.begin(), itEnd = allTests.end();

        // First pass - get max tags
        std::size_t maxTagLen = 0;
        std::size_t maxNameLen = 0;
        for(; it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                maxTagLen = (std::max)( it->getTestCaseInfo().tagsAsString.size(), maxTagLen );
                maxNameLen = (std::max)( it->getTestCaseInfo().name.size(), maxNameLen );
            }
        }

        // Try to fit everything in. If not shrink tag column first, down to 30
        // then shrink name column until it all fits (strings will be wrapped within column)
        while( maxTagLen + maxNameLen > CATCH_CONFIG_CONSOLE_WIDTH-5 ) {
            if( maxTagLen > 30 )
                --maxTagLen;
            else
                --maxNameLen;
        }

        std::size_t matchedTests = 0;
        for( it = allTests.begin(); it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                matchedTests++;
                Text nameWrapper(   it->getTestCaseInfo().name,
                                    TextAttributes()
                                        .setWidth( maxNameLen )
                                        .setInitialIndent(2)
                                        .setIndent(4) );

                Text tagsWrapper(   it->getTestCaseInfo().tagsAsString,
                                    TextAttributes()
                                        .setWidth( maxTagLen )
                                        .setInitialIndent(0)
                                        .setIndent( 2 ) );

                for( std::size_t i = 0; i < (std::max)( nameWrapper.size(), tagsWrapper.size() ); ++i ) {
                    Colour::Code colour = Colour::None;
                    if( it->getTestCaseInfo().isHidden )
                        colour = Colour::SecondaryText;
                    std::string nameCol;
                    if( i < nameWrapper.size() ) {
                        nameCol = nameWrapper[i];
                    }
                    else {
                        nameCol = "    ...";
                        colour = Colour::SecondaryText;
                    }

                    {
                        Colour colourGuard( colour );
                        std::cout << nameCol;
                    }
                    if( i < tagsWrapper.size() && !tagsWrapper[i].empty() ) {
                        if( i == 0 ) {
                            Colour colourGuard( Colour::SecondaryText );
                            std::cout << "  " << std::string( maxNameLen - nameCol.size(), '.' ) << "  ";
                        }
                        else {
                            std::cout << std::string( maxNameLen - nameCol.size(), ' ' ) << "    ";
                        }
                        std::cout << tagsWrapper[i];
                    }
                    std::cout << "\n";
                }
            }
        }
        if( config.filters().empty() )
            std::cout << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            std::cout << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }